

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_export(ptls_t *tls,ptls_buffer_t *output)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  char *__s;
  uint8_t *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ptls_iovec_t negotiated_protocol_00;
  bool bVar9;
  int iVar10;
  int iVar11;
  size_t len;
  size_t len_00;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  bool bVar16;
  ptls_iovec_t negotiated_protocol;
  
  puVar4 = (uint8_t *)tls->negotiated_protocol;
  if (puVar4 == (uint8_t *)0x0) {
    len = 0;
  }
  else {
    len = strlen((char *)puVar4);
  }
  if (tls->state != PTLS_STATE_SERVER_POST_HANDSHAKE) {
    return 0x203;
  }
  if (((tls->traffic_protection).enc.field_0x58 & 1) != 0) {
    negotiated_protocol_00.len = len;
    negotiated_protocol_00.base = puVar4;
    iVar10 = export_tls12_params(output,(byte)tls->field_0x1e8 & 1,(byte)tls->field_0x1e8 >> 1 & 1,
                                 tls->cipher_suite,tls->client_random,tls->server_name,
                                 negotiated_protocol_00,&(tls->traffic_protection).enc,
                                 (tls->traffic_protection).enc.secret + 0x20,
                                 (tls->traffic_protection).enc.seq,
                                 (tls->traffic_protection).enc.tls12_enc_record_iv,
                                 &tls->traffic_protection,
                                 (tls->traffic_protection).dec.secret + 0x20,
                                 (tls->traffic_protection).dec.seq);
    return iVar10;
  }
  __s = tls->server_name;
  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar10 == 0) {
    puVar5 = output->base;
    sVar14 = output->off;
    (puVar5 + sVar14)[0] = '\0';
    (puVar5 + sVar14)[1] = '\0';
    output->off = output->off + 2;
    iVar10 = 0;
  }
  bVar9 = true;
  bVar16 = bVar9;
  if (iVar10 != 0) goto LAB_00117f2d;
  sVar14 = output->off;
  bVar2 = tls->field_0x1e8;
  iVar10 = ptls_buffer_reserve_aligned(output,1,'\0');
  if (iVar10 == 0) {
    output->base[output->off] = bVar2 & 1;
    output->off = output->off + 1;
    iVar10 = 0;
  }
  if (iVar10 != 0) goto LAB_00117f2d;
  bVar2 = tls->field_0x1e8;
  iVar10 = ptls_buffer_reserve_aligned(output,1,'\0');
  if (iVar10 == 0) {
    output->base[output->off] = bVar2 >> 1 & 1;
    output->off = output->off + 1;
    iVar10 = 0;
  }
  if (iVar10 != 0) goto LAB_00117f2d;
  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar10 == 0) {
    puVar5 = output->base;
    sVar15 = output->off;
    (puVar5 + sVar15)[0] = '\x03';
    (puVar5 + sVar15)[1] = '\x04';
    output->off = output->off + 2;
    iVar10 = 0;
  }
  bVar16 = iVar10 != 0;
  if (bVar16) goto LAB_00117f2d;
  uVar3 = tls->cipher_suite->id;
  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar10 == 0) {
    *(ushort *)(output->base + output->off) = uVar3 << 8 | uVar3 >> 8;
    output->off = output->off + 2;
    iVar10 = 0;
  }
  bVar16 = iVar10 != 0;
  if (bVar16) goto LAB_00117f2d;
  iVar10 = ptls_buffer_reserve_aligned(output,0x20,'\0');
  if (iVar10 == 0) {
    puVar5 = output->base;
    sVar15 = output->off;
    uVar6 = *(undefined8 *)tls->client_random;
    uVar7 = *(undefined8 *)(tls->client_random + 8);
    uVar8 = *(undefined8 *)(tls->client_random + 0x18);
    puVar1 = puVar5 + sVar15 + 0x10;
    *(undefined8 *)puVar1 = *(undefined8 *)(tls->client_random + 0x10);
    *(undefined8 *)(puVar1 + 8) = uVar8;
    puVar5 = puVar5 + sVar15;
    *(undefined8 *)puVar5 = uVar6;
    *(undefined8 *)(puVar5 + 8) = uVar7;
    output->off = output->off + 0x20;
    iVar10 = 0;
  }
  bVar16 = bVar9;
  if (iVar10 != 0) goto LAB_00117f2d;
  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar10 == 0) {
    puVar5 = output->base;
    sVar15 = output->off;
    (puVar5 + sVar15)[0] = '\0';
    (puVar5 + sVar15)[1] = '\0';
    output->off = output->off + 2;
    iVar10 = 0;
  }
  bVar16 = true;
  if (iVar10 == 0) {
    sVar15 = output->off;
    if (__s == (char *)0x0) {
      len_00 = 0;
    }
    else {
      len_00 = strlen(__s);
    }
    iVar11 = ptls_buffer__do_pushv(output,__s,len_00);
    bVar16 = iVar11 != 0;
    iVar10 = iVar11;
    if (iVar11 == 0) {
      uVar12 = output->off - sVar15;
      iVar10 = 0x20c;
      bVar16 = true;
      if (uVar12 < 0x10000) {
        lVar13 = 8;
        do {
          output->base[sVar15 - 2] = (uint8_t)(uVar12 >> ((byte)lVar13 & 0x3f));
          lVar13 = lVar13 + -8;
          sVar15 = sVar15 + 1;
        } while (lVar13 != -8);
        bVar16 = false;
        iVar10 = iVar11;
      }
    }
  }
  if (bVar16) goto LAB_00117f2d;
  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar10 == 0) {
    puVar5 = output->base;
    sVar15 = output->off;
    (puVar5 + sVar15)[0] = '\0';
    (puVar5 + sVar15)[1] = '\0';
    output->off = output->off + 2;
    iVar10 = 0;
  }
  bVar16 = true;
  if (iVar10 == 0) {
    sVar15 = output->off;
    iVar10 = ptls_buffer__do_pushv(output,puVar4,len);
    if (iVar10 != 0) goto LAB_00118122;
    uVar12 = output->off - sVar15;
    if (0xffff < uVar12) {
      iVar10 = 0x20c;
      goto LAB_00118122;
    }
    lVar13 = 8;
    do {
      output->base[sVar15 - 2] = (uint8_t)(uVar12 >> ((byte)lVar13 & 0x3f));
      lVar13 = lVar13 + -8;
      sVar15 = sVar15 + 1;
    } while (lVar13 != -8);
    bVar16 = false;
    bVar9 = true;
    iVar10 = 0;
  }
  else {
LAB_00118122:
    bVar9 = false;
  }
  if (bVar9) {
    iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
    if (iVar10 == 0) {
      puVar4 = output->base;
      sVar15 = output->off;
      (puVar4 + sVar15)[0] = '\0';
      (puVar4 + sVar15)[1] = '\0';
      output->off = output->off + 2;
      iVar10 = 0;
    }
    bVar9 = true;
    bVar16 = bVar9;
    if (iVar10 == 0) {
      sVar15 = output->off;
      iVar10 = ptls_buffer__do_pushv
                         (output,&(tls->traffic_protection).enc,tls->cipher_suite->hash->digest_size
                         );
      if (iVar10 == 0) {
        uVar12 = (tls->traffic_protection).enc.seq;
        iVar10 = ptls_buffer_reserve_aligned(output,8,'\0');
        if (iVar10 == 0) {
          *(ulong *)(output->base + output->off) =
               uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
               | uVar12 << 0x38;
          output->off = output->off + 8;
          iVar10 = 0;
        }
        bVar16 = iVar10 != 0;
        if ((iVar10 == 0) &&
           (iVar10 = ptls_buffer__do_pushv
                               (output,&tls->traffic_protection,tls->cipher_suite->hash->digest_size
                               ), bVar16 = bVar9, iVar10 == 0)) {
          uVar12 = (tls->traffic_protection).dec.seq;
          iVar11 = ptls_buffer_reserve_aligned(output,8,'\0');
          if (iVar11 == 0) {
            *(ulong *)(output->base + output->off) =
                 uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
            output->off = output->off + 8;
            iVar11 = 0;
          }
          bVar16 = iVar11 != 0;
          iVar10 = iVar11;
          if (iVar11 == 0) {
            uVar12 = output->off - sVar15;
            iVar10 = 0x20c;
            bVar16 = bVar9;
            if (uVar12 < 0x10000) {
              lVar13 = 8;
              bVar16 = false;
              do {
                output->base[sVar15 - 2] = (uint8_t)(uVar12 >> ((byte)lVar13 & 0x3f));
                lVar13 = lVar13 + -8;
                sVar15 = sVar15 + 1;
                iVar10 = iVar11;
              } while (lVar13 != -8);
            }
          }
        }
      }
    }
    if (!bVar16) {
      iVar11 = ptls_buffer_reserve_aligned(output,2,'\0');
      if (iVar11 == 0) {
        puVar4 = output->base;
        sVar15 = output->off;
        (puVar4 + sVar15)[0] = '\0';
        (puVar4 + sVar15)[1] = '\0';
        output->off = output->off + 2;
        iVar11 = 0;
      }
      bVar16 = true;
      iVar10 = iVar11;
      if (iVar11 == 0) {
        sVar15 = output->off;
        lVar13 = -2;
        do {
          output->base[lVar13 + sVar15] = '\0';
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0);
        bVar16 = false;
        iVar10 = 0;
      }
      if (iVar11 == 0) {
        uVar12 = output->off - sVar14;
        if (uVar12 < 0x10000) {
          lVar13 = 8;
          bVar16 = false;
          do {
            output->base[sVar14 - 2] = (uint8_t)(uVar12 >> ((byte)lVar13 & 0x3f));
            lVar13 = lVar13 + -8;
            sVar14 = sVar14 + 1;
          } while (lVar13 != -8);
        }
        else {
          iVar10 = 0x20c;
          bVar16 = true;
        }
      }
    }
  }
LAB_00117f2d:
  if (!bVar16) {
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int ptls_export(ptls_t *tls, ptls_buffer_t *output)
{
    ptls_iovec_t negotiated_protocol =
        ptls_iovec_init(tls->negotiated_protocol, tls->negotiated_protocol != NULL ? strlen(tls->negotiated_protocol) : 0);
    int ret;

    if (tls->state != PTLS_STATE_SERVER_POST_HANDSHAKE) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    if (ptls_get_protocol_version(tls) == PTLS_PROTOCOL_VERSION_TLS13) {
        export_tls_params(output, tls->is_server, tls->is_psk_handshake, PTLS_PROTOCOL_VERSION_TLS13, tls->cipher_suite,
                          tls->client_random, tls->server_name, negotiated_protocol, {
                              ptls_buffer_pushv(output, tls->traffic_protection.enc.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.enc.seq);
                              ptls_buffer_pushv(output, tls->traffic_protection.dec.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.dec.seq);
                          });
        ret = 0;
    } else {
        if ((ret = export_tls12_params(output, tls->is_server, tls->is_psk_handshake, tls->cipher_suite, tls->client_random,
                                       tls->server_name, negotiated_protocol, tls->traffic_protection.enc.secret,
                                       tls->traffic_protection.enc.secret + PTLS_MAX_SECRET_SIZE, tls->traffic_protection.enc.seq,
                                       tls->traffic_protection.enc.tls12_enc_record_iv, tls->traffic_protection.dec.secret,
                                       tls->traffic_protection.dec.secret + PTLS_MAX_SECRET_SIZE,
                                       tls->traffic_protection.dec.seq)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}